

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void aom_highbd_convolve8_horiz_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  InterpKernel *base;
  ptrdiff_t in_RCX;
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  InterpKernel *in_R8;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int x0_q4;
  InterpKernel *filters_x;
  
  base = get_filter_base(*in_R8);
  get_filter_offset(*in_R8,base);
  highbd_convolve_horiz
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9D,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

void aom_highbd_convolve8_horiz_c(const uint8_t *src, ptrdiff_t src_stride,
                                  uint8_t *dst, ptrdiff_t dst_stride,
                                  const int16_t *filter_x, int x_step_q4,
                                  const int16_t *filter_y, int y_step_q4, int w,
                                  int h, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);
  (void)filter_y;
  (void)y_step_q4;

  highbd_convolve_horiz(src, src_stride, dst, dst_stride, filters_x, x0_q4,
                        x_step_q4, w, h, bd);
}